

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps3,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  int *piVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  undefined4 uVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  uint local_52c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_4a0;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_d8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_d8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_d8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_d8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_d8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_d8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_d8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_d8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_d8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8)
  ;
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
  local_128.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
  local_128.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
  local_128.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
  vSolveLright3(this,rhs,ridx,rn,&local_88,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend.data._M_elems._40_8_,&local_d8,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend._72_8_,(int *)vec2,idx2,&local_128);
  piVar5 = (this->row).perm;
  if (rhs2 == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0x0) {
    if (*rn < 1) {
      iVar17 = 0;
    }
    else {
      lVar23 = 0;
      uVar24 = 0;
      do {
        uVar19 = (uint)uVar24;
        iVar17 = ridx[lVar23];
        result.m_backend.exp = rhs[iVar17].m_backend.exp;
        result.m_backend.neg = rhs[iVar17].m_backend.neg;
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar17].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[iVar17].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 8;
        result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 0xc;
        result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        result.m_backend.fpclass = rhs[iVar17].m_backend.fpclass;
        result.m_backend.prec_elem = rhs[iVar17].m_backend.prec_elem;
        local_3a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_3a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_3a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_3a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_3a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_3a8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_3a8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_3a8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_3a8.exp = (eps->m_backend).exp;
        local_3a8.neg = (eps->m_backend).neg;
        local_3a8.fpclass = (eps->m_backend).fpclass;
        local_3a8.prec_elem = (eps->m_backend).prec_elem;
        if ((result.m_backend.neg == true) &&
           (result.m_backend.data._M_elems[0] != 0 ||
            result.m_backend.fpclass != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        if ((local_3a8.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN
            ) || (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (&result.m_backend,&local_3a8), iVar16 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar17].m_backend,0);
        }
        else {
          iVar17 = piVar5[iVar17];
          uVar20 = uVar19;
          if (0 < (int)uVar19) {
            do {
              uVar25 = (uint)uVar24 - 1;
              uVar18 = uVar25 >> 1;
              uVar20 = (uint)uVar24;
              if (iVar17 <= ridx[uVar18]) break;
              ridx[uVar24] = ridx[uVar18];
              uVar24 = (ulong)uVar18;
              uVar20 = uVar18;
            } while (1 < uVar25);
          }
          uVar24 = (ulong)(uVar19 + 1);
          ridx[(int)uVar20] = iVar17;
        }
        iVar17 = (int)uVar24;
        lVar23 = lVar23 + 1;
      } while (lVar23 < *rn);
    }
    *rn = iVar17;
  }
  else {
    if (*rn < 1) {
      local_52c = 0;
    }
    else {
      local_4a0 = rn2;
      lVar23 = 0;
      local_52c = 0;
      do {
        iVar17 = ridx[lVar23];
        uVar7 = *(undefined8 *)rhs[iVar17].m_backend.data._M_elems;
        uVar8 = *(undefined8 *)(rhs[iVar17].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 4;
        uVar9 = *(undefined8 *)puVar1;
        uVar10 = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 8;
        uVar11 = *(undefined8 *)puVar1;
        uVar12 = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 0xc;
        uVar13 = *(undefined8 *)puVar1;
        uVar14 = *(undefined8 *)(puVar1 + 2);
        iVar16 = rhs[iVar17].m_backend.exp;
        bVar2 = rhs[iVar17].m_backend.neg;
        fVar3 = rhs[iVar17].m_backend.fpclass;
        iVar4 = rhs[iVar17].m_backend.prec_elem;
        result.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar17].m_backend.data._M_elems;
        result.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(rhs[iVar17].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 4;
        result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 8;
        result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = rhs[iVar17].m_backend.data._M_elems + 0xc;
        result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        result.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_358.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_358.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_358.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_358.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_358.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_358.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_358.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_358.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_358.exp = (eps->m_backend).exp;
        local_358.neg = (eps->m_backend).neg;
        local_358.fpclass = (eps->m_backend).fpclass;
        local_358.prec_elem = (eps->m_backend).prec_elem;
        result.m_backend.prec_elem = iVar4;
        result.m_backend.fpclass = fVar3;
        result.m_backend.neg = bVar2;
        if ((bVar2 == true) &&
           (result.m_backend.data._M_elems[0] != 0 || fVar3 != cpp_dec_float_finite)) {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar16;
        if ((local_358.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&result.m_backend,&local_358), iVar15 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar17].m_backend,0);
        }
        else {
          *local_4a0 = iVar17;
          iVar15 = piVar5[iVar17];
          uVar19 = local_52c;
          if (0 < (int)local_52c) {
            do {
              uVar20 = uVar19 - 1;
              uVar18 = uVar20 >> 1;
              if (iVar15 <= ridx[uVar18]) break;
              ridx[uVar19] = ridx[uVar18];
              uVar19 = uVar18;
            } while (1 < uVar20);
          }
          local_4a0 = local_4a0 + 1;
          local_52c = local_52c + 1;
          ridx[(int)uVar19] = iVar15;
          puVar1 = rhs2[iVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar1 = uVar13;
          *(undefined8 *)(puVar1 + 2) = uVar14;
          puVar1 = rhs2[iVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar1 = uVar11;
          *(undefined8 *)(puVar1 + 2) = uVar12;
          puVar1 = rhs2[iVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = uVar9;
          *(undefined8 *)(puVar1 + 2) = uVar10;
          *(undefined8 *)rhs2[iVar17].m_backend.data._M_elems = uVar7;
          *(undefined8 *)(rhs2[iVar17].m_backend.data._M_elems + 2) = uVar8;
          rhs2[iVar17].m_backend.exp = iVar16;
          rhs2[iVar17].m_backend.neg = bVar2;
          rhs2[iVar17].m_backend.fpclass = fVar3;
          rhs2[iVar17].m_backend.prec_elem = iVar4;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < *rn);
    }
    *rn = local_52c;
    *ridx2 = local_52c;
  }
  local_52c = 0;
  uVar22 = 0;
  if (0 < *(int *)eps2.m_backend.data._M_elems._40_8_) {
    lVar23 = 0;
    uVar24 = 0;
    do {
      uVar19 = (uint)uVar24;
      lVar26 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar23 * 4);
      lVar21 = lVar26 * 0x50;
      result.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x40 + lVar21);
      result.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._24_8_ + 0x44 + lVar21);
      result.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar21);
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._24_8_ + lVar21) + 2);
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar21);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar21);
      result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar21);
      result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      result.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x48 + lVar21)
      ;
      local_3f8.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
      local_3f8.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
      local_3f8.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
      local_3f8.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
      local_3f8.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
      local_3f8.data._M_elems._40_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
      local_3f8.data._M_elems._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
      local_3f8.data._M_elems._56_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
      local_3f8.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
      local_3f8.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
      local_3f8._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
      if ((result.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         )) {
        result.m_backend.neg = false;
      }
      if ((local_3f8.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN)
         || (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&result.m_backend,&local_3f8), iVar17 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)(lVar21 + eps2.m_backend.data._M_elems._24_8_),
                   0);
      }
      else {
        iVar17 = piVar5[lVar26];
        uVar20 = uVar19;
        if (0 < (int)uVar19) {
          do {
            uVar25 = (uint)uVar24 - 1;
            uVar18 = uVar25 >> 1;
            iVar16 = *(int *)(eps2.m_backend.data._M_elems._32_8_ + (ulong)uVar18 * 4);
            uVar20 = (uint)uVar24;
            if (iVar17 <= iVar16) break;
            *(int *)(eps2.m_backend.data._M_elems._32_8_ + uVar24 * 4) = iVar16;
            uVar24 = (ulong)uVar18;
            uVar20 = uVar18;
          } while (1 < uVar25);
        }
        uVar24 = (ulong)(uVar19 + 1);
        *(int *)(eps2.m_backend.data._M_elems._32_8_ + (long)(int)uVar20 * 4) = iVar17;
      }
      uVar22 = (undefined4)uVar24;
      lVar23 = lVar23 + 1;
    } while (lVar23 < *(int *)eps2.m_backend.data._M_elems._40_8_);
  }
  *(undefined4 *)eps2.m_backend.data._M_elems._40_8_ = uVar22;
  if (0 < *idx2) {
    lVar23 = 0;
    local_52c = 0;
    do {
      lVar26 = (long)(int)(vec2->m_backend).data._M_elems[lVar23];
      lVar21 = lVar26 * 0x50;
      result.m_backend.exp = *(int *)(eps2.m_backend._72_8_ + 0x40 + lVar21);
      result.m_backend.neg = *(bool *)(eps2.m_backend._72_8_ + 0x44 + lVar21);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend._72_8_ + lVar21);
      result.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((uint *)(eps2.m_backend._72_8_ + lVar21) + 2);
      puVar1 = (uint *)(eps2.m_backend._72_8_ + 0x10 + lVar21);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(eps2.m_backend._72_8_ + 0x20 + lVar21);
      result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(eps2.m_backend._72_8_ + 0x30 + lVar21);
      result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      result.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      result.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend._72_8_ + 0x48 + lVar21);
      local_448.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
      local_448.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8);
      local_448.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
      local_448.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
      local_448.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
      local_448.data._M_elems._40_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
      local_448.data._M_elems._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
      local_448.data._M_elems._56_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
      local_448.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
      local_448.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
      local_448._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
      if ((result.m_backend.neg == true) &&
         (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         )) {
        result.m_backend.neg = false;
      }
      if ((local_448.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN)
         || (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&result.m_backend,&local_448), iVar17 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)(lVar21 + eps2.m_backend._72_8_),0);
      }
      else {
        uVar19 = piVar5[lVar26];
        uVar20 = local_52c;
        if (0 < (int)local_52c) {
          do {
            uVar18 = uVar20 - 1;
            uVar6 = uVar18 >> 1;
            uVar25 = (vec2->m_backend).data._M_elems[uVar6];
            if ((int)uVar19 <= (int)uVar25) break;
            (vec2->m_backend).data._M_elems[uVar20] = uVar25;
            uVar20 = uVar6;
          } while (1 < uVar18);
        }
        local_52c = local_52c + 1;
        (vec2->m_backend).data._M_elems[(int)uVar20] = uVar19;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < *idx2);
  }
  *idx2 = local_52c;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_178.m_backend.exp = (eps->m_backend).exp;
  local_178.m_backend.neg = (eps->m_backend).neg;
  local_178.m_backend.fpclass = (eps->m_backend).fpclass;
  local_178.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar17 = vSolveUright(this,vec,idx,rhs,ridx,*rn,&local_178);
  *rn = iVar17;
  local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_1c8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_1c8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_1c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_1c8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_1c8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_1c8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_1c8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_1c8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_1c8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  iVar17 = vSolveUright(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)eps2.m_backend.data._M_elems._8_8_,
                        (int *)eps2.m_backend.data._M_elems._16_8_,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)eps2.m_backend.data._M_elems._24_8_,
                        (int *)eps2.m_backend.data._M_elems._32_8_,
                        *(int *)eps2.m_backend.data._M_elems._40_8_,&local_1c8);
  *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar17;
  local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
  local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8)
  ;
  local_218.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
  local_218.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
  local_218.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
  local_218.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
  local_218.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
  local_218.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
  local_218.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
  local_218.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
  local_218.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
  iVar17 = vSolveUright(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)eps2.m_backend.data._M_elems._56_8_,(int *)eps2.m_backend._64_8_,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)eps2.m_backend._72_8_,(int *)vec2,*idx2,&local_218);
  *idx2 = iVar17;
  if ((this->l).updateType == 0) {
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_268.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_268.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc)
    ;
    local_268.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe)
    ;
    local_268.m_backend.exp = (eps->m_backend).exp;
    local_268.m_backend.neg = (eps->m_backend).neg;
    local_268.m_backend.fpclass = (eps->m_backend).fpclass;
    local_268.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar17 = vSolveUpdateRight(this,vec,idx,*rn,&local_268);
    *rn = iVar17;
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_2b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_2b8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_2b8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_2b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_2b8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_2b8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    local_2b8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
    local_2b8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
    local_2b8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
    local_2b8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
    iVar17 = vSolveUpdateRight(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)eps2.m_backend.data._M_elems._8_8_,
                               (int *)eps2.m_backend.data._M_elems._16_8_,
                               *(int *)eps2.m_backend.data._M_elems._40_8_,&local_2b8);
    *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar17;
    local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
    local_308.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8);
    local_308.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
    local_308.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
    local_308.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
    local_308.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
    local_308.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
    local_308.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
    local_308.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
    local_308.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
    local_308.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
    iVar17 = vSolveUpdateRight(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)eps2.m_backend.data._M_elems._56_8_,
                               (int *)eps2.m_backend._64_8_,*idx2,&local_308);
    *idx2 = iVar17;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}